

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

WORD32 dispq_producer_dequeue(vid_dec_ctx_t *ps_app_ctx)

{
  WORD32 idx;
  vid_dec_ctx_t *ps_app_ctx_local;
  
  do {
    if ((ps_app_ctx->disp_q_wr_idx + 1) % 4 != ps_app_ctx->disp_q_rd_idx) {
      return ps_app_ctx->disp_q_wr_idx;
    }
    ithread_msleep(0);
  } while (ps_app_ctx->quit == 0);
  return -1;
}

Assistant:

WORD32 dispq_producer_dequeue(vid_dec_ctx_t *ps_app_ctx)
{
    WORD32 idx;

    /* If there is no free buffer wait */

    while(((ps_app_ctx->disp_q_wr_idx + 1) % NUM_DISPLAY_BUFFERS) == ps_app_ctx->disp_q_rd_idx)
    {

        ithread_msleep(1);

        if(ps_app_ctx->quit)
            return (-1);
    }

    idx = ps_app_ctx->disp_q_wr_idx;
    return (idx);
}